

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_weakref(HSQUIRRELVM v,SQInteger idx)

{
  SQWeakRef *x;
  SQCollectable *in_RDI;
  SQObject *o;
  SQInteger in_stack_ffffffffffffff98;
  HSQUIRRELVM in_stack_ffffffffffffffa0;
  SQObjectPtr *this;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQVM *in_stack_ffffffffffffffb0;
  SQVM *this_00;
  SQObjectPtr local_48 [2];
  SQWeakRef *local_18;
  SQCollectable *local_8;
  
  local_8 = in_RDI;
  local_18 = (SQWeakRef *)stack_get(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (((ulong)(local_18->super_SQRefCounted)._vptr_SQRefCounted & 0x8000000) == 0) {
    this = local_48;
    SQObjectPtr::SQObjectPtr(this,(SQObject *)local_18);
    SQVM::Push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    SQObjectPtr::~SQObjectPtr(this);
  }
  else {
    x = SQRefCounted::GetWeakRef
                  ((SQRefCounted *)in_stack_ffffffffffffffb0,(SQAllocContext)local_8,
                   (SQObjectType)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (SQObjectFlags)((ulong)in_stack_ffffffffffffffa0 >> 0x18));
    this_00 = (SQVM *)&stack0xffffffffffffffd8;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00,x);
    SQVM::Push(this_00,(SQObjectPtr *)local_8);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void sq_weakref(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    if(ISREFCOUNTED(sq_type(o))) {
        v->Push(_refcounted(o)->GetWeakRef(_ss(v)->_alloc_ctx, sq_type(o), o._flags));
        return;
    }
    v->Push(o);
}